

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O3

LispPTR N_OP_lrsh8(LispPTR a)

{
  uint *puVar1;
  LispPTR LVar2;
  uint uVar3;
  
  if ((a & 0xfff0000) == 0xf0000) {
    uVar3 = a >> 8 | 0xffff00;
LAB_0013015c:
    puVar1 = (uint *)createcell68k(2);
    *puVar1 = uVar3;
    if (((ulong)puVar1 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",puVar1);
    }
    LVar2 = (LispPTR)((ulong)((long)puVar1 - (long)Lisp_world) >> 1);
  }
  else {
    if ((a & 0xfff0000) == 0xe0000) {
      uVar3 = a >> 8 & 0xff;
    }
    else {
      if ((*(ushort *)((ulong)(a >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = a;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((a & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)a);
      }
      uVar3 = *(uint *)(Lisp_world + a) >> 8;
      if (0xffffff < *(uint *)(Lisp_world + a)) goto LAB_0013015c;
    }
    LVar2 = uVar3 | 0xe0000;
  }
  return LVar2;
}

Assistant:

LispPTR N_OP_lrsh8(LispPTR a) {
  int arg1;

  N_GETNUMBER(a, arg1, du_ufn);
  arg1 = (unsigned)arg1 >> 8;
  N_ARITH_SWITCH(arg1);

 du_ufn:
  ERROR_EXIT(a);
}